

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
Read(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *this,
    BinaryReader<mp::internal::IdentityConverter> *bound_reader)

{
  StringRef name_00;
  bool bVar1;
  long in_RSI;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *in_RDI;
  int info;
  StringRef name;
  int num_args;
  int type;
  int index_3;
  LinearExprHandler expr_handler;
  int position;
  int num_linear_terms;
  int expr_index;
  NumericExpr expr;
  int obj_type;
  int index_2;
  int index_1;
  int index;
  char c;
  bool read_bounds;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  LogicalExpr *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  Type in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  ExprPrinter *in_stack_fffffffffffffe50;
  BinaryReader<mp::internal::IdentityConverter> *in_stack_fffffffffffffe58;
  CStringRef in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
  *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe84;
  ExprPrinter *in_stack_fffffffffffffe88;
  int info_00;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  BasicCStringRef<char> local_140;
  BasicCStringRef<char> local_138;
  BasicCStringRef<char> local_130;
  BasicCStringRef<char> local_128;
  Type local_11c;
  char *local_118;
  size_t local_110;
  StringRef local_108;
  int local_f4;
  BasicCStringRef<char> local_f0;
  int local_e8;
  int local_e4;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> local_e0;
  int local_bc;
  int local_b8;
  int local_b4;
  string local_b0 [32];
  string local_90 [32];
  int local_70;
  int local_6c;
  string local_68 [32];
  int local_48;
  string local_38 [32];
  int local_18;
  char local_12;
  byte local_11;
  long local_10;
  
  local_11 = in_RSI == 0;
  in_RDI->num_vars_and_exprs_ =
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons
       + (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.
         num_common_exprs_in_single_objs;
  local_10 = in_RSI;
  do {
    local_12 = ReaderBase::ReadChar((ReaderBase *)in_RDI->reader_);
    switch(local_12) {
    case '\0':
      bVar1 = ReaderBase::IsEOF((ReaderBase *)0x156917);
      if (bVar1) {
        if ((local_11 & 1) != 0) {
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_138,"segment \'b\' missing");
          BinaryReaderBase::ReportError<>
                    (&in_stack_fffffffffffffe58->super_BinaryReaderBase,in_stack_fffffffffffffe60);
        }
        return;
      }
    default:
      in_stack_fffffffffffffe30 = (LogicalExpr *)in_RDI->reader_;
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_140,"invalid segment type");
      BinaryReaderBase::ReportError<>
                (&in_stack_fffffffffffffe58->super_BinaryReaderBase,in_stack_fffffffffffffe60);
      break;
    case 'C':
      local_18 = ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                           *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      in_stack_fffffffffffffea4 = local_18;
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
      ReadNumericExpr_abi_cxx11_
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                  *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0));
      ExprPrinter::OnAlgebraicCon
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40);
      std::__cxx11::string::~string(local_38);
      break;
    case 'F':
      local_e4 = ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                           *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      local_e8 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                           ((BinaryReader<mp::internal::IdentityConverter> *)
                            in_stack_fffffffffffffe40);
      if ((local_e8 != 0) && (local_e8 != 1)) {
        in_stack_fffffffffffffe58 = in_RDI->reader_;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_f0,"invalid function type");
        BinaryReaderBase::ReportError<>
                  (&in_stack_fffffffffffffe58->super_BinaryReaderBase,in_stack_fffffffffffffe60);
      }
      local_f4 = BinaryReader<mp::internal::IdentityConverter>::ReadInt<int>
                           ((BinaryReader<mp::internal::IdentityConverter> *)
                            in_stack_fffffffffffffe30);
      local_108 = BinaryReader<mp::internal::IdentityConverter>::ReadName
                            ((BinaryReader<mp::internal::IdentityConverter> *)0x156676);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      local_118 = local_108.data_;
      local_110 = local_108.size_;
      name_00.data_._4_4_ = in_stack_fffffffffffffe4c;
      name_00.data_._0_4_ = in_stack_fffffffffffffe48;
      name_00.size_ = (size_t)in_stack_fffffffffffffe50;
      NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::OnFunction((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                   name_00,(int)in_stack_fffffffffffffe38,
                   (Type)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      break;
    case 'G':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::ObjHandler>
                (in_stack_fffffffffffffe70);
      break;
    case 'J':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::AlgebraicConHandler>
                (in_stack_fffffffffffffe70);
      break;
    case 'K':
      ReadColumnSizes<false>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                  *)in_stack_fffffffffffffe50);
      break;
    case 'L':
      local_48 = ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                           *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      in_stack_fffffffffffffe88 = in_RDI->handler_;
      in_stack_fffffffffffffe94 = local_48;
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
      ReadLogicalExpr_abi_cxx11_
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                  *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::OnLogicalCon((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                     in_stack_fffffffffffffe30);
      std::__cxx11::string::~string(local_68);
      break;
    case 'O':
      local_6c = ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                           *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      local_70 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                           ((BinaryReader<mp::internal::IdentityConverter> *)
                            in_stack_fffffffffffffe40);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
      ReadNumericExpr_abi_cxx11_
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                  *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0));
      bVar1 = NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::NeedObj((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      if (bVar1) {
        in_stack_fffffffffffffe80 =
             NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::resulting_obj_index
                       ((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_RDI->handler_,local_6c);
        in_stack_fffffffffffffe84 = (uint)(local_70 != 0);
        std::__cxx11::string::string(local_b0,local_90);
        ExprPrinter::OnObj(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                           in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        std::__cxx11::string::~string(local_b0);
      }
      std::__cxx11::string::~string(local_90);
      break;
    case 'S':
      local_11c = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                            ((BinaryReader<mp::internal::IdentityConverter> *)
                             in_stack_fffffffffffffe40);
      if (7 < (int)local_11c) {
        in_stack_fffffffffffffe50 = (ExprPrinter *)in_RDI->reader_;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_128,"invalid suffix kind");
        BinaryReaderBase::ReportError<>
                  (&in_stack_fffffffffffffe58->super_BinaryReaderBase,in_stack_fffffffffffffe60);
      }
      in_stack_fffffffffffffe48 = local_11c & 3;
      in_stack_fffffffffffffe4c = 0;
      info_00 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
      switch(in_stack_fffffffffffffe48) {
      case MIN:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                    *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),info_00);
        break;
      case MAX:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::ConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                    *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),info_00);
        break;
      case 2:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::ObjHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                    *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),info_00);
        break;
      case 3:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::ProblemHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                    *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),info_00);
      }
      break;
    case 'V':
      local_b4 = ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                           *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                          in_stack_fffffffffffffe48);
      local_b4 = local_b4 - (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
      local_b8 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                           ((BinaryReader<mp::internal::IdentityConverter> *)
                            in_stack_fffffffffffffe40);
      local_bc = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                           ((BinaryReader<mp::internal::IdentityConverter> *)
                            in_stack_fffffffffffffe40);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::BeginCommonExpr((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                        in_stack_fffffffffffffe28);
      if (local_b8 != 0) {
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
        ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::LinearExprHandler>
                  (in_RDI,local_b8);
      }
      in_stack_fffffffffffffe60.data_ = (char *)in_RDI->handler_;
      in_stack_fffffffffffffe70 = &local_e0;
      in_stack_fffffffffffffe6c = local_b4;
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
      ReadNumericExpr_abi_cxx11_
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                  *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0));
      NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::EndCommonExpr((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                      in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      std::__cxx11::string::~string((string *)&local_e0);
      break;
    case 'b':
      if ((local_11 & 1) == 0) {
        if (local_10 == 0) {
          in_stack_fffffffffffffe40 = (string *)in_RDI->reader_;
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_130,"duplicate \'b\' segment");
          BinaryReaderBase::ReportError<>
                    (&in_stack_fffffffffffffe58->super_BinaryReaderBase,in_stack_fffffffffffffe60);
        }
        BinaryReader<mp::internal::IdentityConverter>::operator=
                  ((BinaryReader<mp::internal::IdentityConverter> *)in_stack_fffffffffffffe30,
                   (BinaryReader<mp::internal::IdentityConverter> *)
                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        local_10 = 0;
      }
      else {
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
        ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                    *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        ReaderBase::ptr((ReaderBase *)in_RDI->reader_);
        if ((in_RDI->flags_ & 1U) != 0) {
          return;
        }
        local_11 = 0;
      }
      break;
    case 'd':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                  *)in_stack_fffffffffffffe60.data_);
      break;
    case 'k':
      ReadColumnSizes<true>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                  *)in_stack_fffffffffffffe60.data_);
      break;
    case 'r':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
      ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                  *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      break;
    case 'x':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::VarHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                  *)in_stack_fffffffffffffe60.data_);
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}